

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alone_decoder.c
# Opt level: O0

lzma_ret alone_decode(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                     size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  _Bool _Var1;
  uint uVar2;
  lzma_ret lVar3;
  long lVar4;
  ulong uVar5;
  uint64_t uVar6;
  bool bVar7;
  undefined1 auStack_88 [4];
  lzma_ret ret;
  lzma_filter_info filters [2];
  uint32_t d;
  lzma_alone_coder *coder;
  uint8_t *out_local;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_allocator *allocator_local;
  void *coder_ptr_local;
  
LAB_00a21457:
  do {
    bVar7 = false;
    if ((*out_pos < out_size) && (bVar7 = true, *(int *)((long)coder_ptr + 0x48) != 4)) {
      bVar7 = *in_pos < in_size;
    }
    if (!bVar7) {
      return LZMA_OK;
    }
    switch(*(undefined4 *)((long)coder_ptr + 0x48)) {
    case 0:
      _Var1 = lzma_lzma_lclppb_decode((lzma_options_lzma *)((long)coder_ptr + 0x70),in[*in_pos]);
      if (_Var1) {
        return LZMA_FORMAT_ERROR;
      }
      *(undefined4 *)((long)coder_ptr + 0x48) = 1;
      *in_pos = *in_pos + 1;
      break;
    case 1:
      *(uint *)((long)coder_ptr + 0x70) =
           *(uint *)((long)coder_ptr + 0x70) |
           (uint)in[*in_pos] << ((byte)(*(long *)((long)coder_ptr + 0x50) << 3) & 0x3f);
      lVar4 = *(long *)((long)coder_ptr + 0x50) + 1;
      *(long *)((long)coder_ptr + 0x50) = lVar4;
      if (lVar4 == 4) {
        if ((((*(byte *)((long)coder_ptr + 0x4c) & 1) != 0) &&
            (*(int *)((long)coder_ptr + 0x70) != -1)) &&
           (uVar2 = *(int *)((long)coder_ptr + 0x70) - 1, uVar2 = uVar2 >> 2 | uVar2,
           uVar2 = uVar2 >> 3 | uVar2, uVar2 = uVar2 >> 4 | uVar2, uVar2 = uVar2 >> 8 | uVar2,
           filters[1].options._4_4_ = (uVar2 >> 0x10 | uVar2) + 1,
           filters[1].options._4_4_ != *(int *)((long)coder_ptr + 0x70))) {
          return LZMA_FORMAT_ERROR;
        }
        *(undefined8 *)((long)coder_ptr + 0x50) = 0;
        *(undefined4 *)((long)coder_ptr + 0x48) = 2;
      }
      *in_pos = *in_pos + 1;
      break;
    case 2:
      goto switchD_00a214da_caseD_2;
    case 3:
      goto switchD_00a214da_caseD_3;
    case 4:
      lVar3 = (**(code **)((long)coder_ptr + 0x18))
                        (*coder_ptr,allocator,in,in_pos,in_size,out,out_pos,out_size,action);
      return lVar3;
    default:
      return LZMA_PROG_ERROR;
    }
  } while( true );
switchD_00a214da_caseD_2:
  *(ulong *)((long)coder_ptr + 0x58) =
       (ulong)in[*in_pos] << ((byte)(*(long *)((long)coder_ptr + 0x50) << 3) & 0x3f) |
       *(ulong *)((long)coder_ptr + 0x58);
  *in_pos = *in_pos + 1;
  uVar5 = *(long *)((long)coder_ptr + 0x50) + 1;
  *(ulong *)((long)coder_ptr + 0x50) = uVar5;
  if (7 < uVar5) {
    if ((((*(byte *)((long)coder_ptr + 0x4c) & 1) != 0) && (*(long *)((long)coder_ptr + 0x58) != -1)
        ) && (0x3fffffffff < *(ulong *)((long)coder_ptr + 0x58))) {
      return LZMA_FORMAT_ERROR;
    }
    uVar6 = lzma_lzma_decoder_memusage((void *)((long)coder_ptr + 0x70));
    *(uint64_t *)((long)coder_ptr + 0x68) = uVar6 + 0x8000;
    *(undefined8 *)((long)coder_ptr + 0x50) = 0;
    *(undefined4 *)((long)coder_ptr + 0x48) = 3;
switchD_00a214da_caseD_3:
    if (*(ulong *)((long)coder_ptr + 0x60) < *(ulong *)((long)coder_ptr + 0x68)) {
      return LZMA_MEMLIMIT_ERROR;
    }
    _auStack_88 = 0;
    filters[0].id = (lzma_vli)lzma_lzma_decoder_init;
    filters[0].init = (lzma_init_function)((long)coder_ptr + 0x70);
    memset(&filters[0].options,0,0x18);
    lVar3 = lzma_next_filter_init
                      ((lzma_next_coder *)coder_ptr,allocator,(lzma_filter_info *)auStack_88);
    if (lVar3 != LZMA_OK) {
      return lVar3;
    }
    lzma_lz_decoder_uncompressed(*coder_ptr,*(lzma_vli *)((long)coder_ptr + 0x58));
    *(undefined4 *)((long)coder_ptr + 0x48) = 4;
  }
  goto LAB_00a21457;
}

Assistant:

static lzma_ret
alone_decode(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size,
		lzma_action action)
{
	lzma_alone_coder *coder = coder_ptr;

	while (*out_pos < out_size
			&& (coder->sequence == SEQ_CODE || *in_pos < in_size))
	switch (coder->sequence) {
	case SEQ_PROPERTIES:
		if (lzma_lzma_lclppb_decode(&coder->options, in[*in_pos]))
			return LZMA_FORMAT_ERROR;

		coder->sequence = SEQ_DICTIONARY_SIZE;
		++*in_pos;
		break;

	case SEQ_DICTIONARY_SIZE:
		coder->options.dict_size
				|= (size_t)(in[*in_pos]) << (coder->pos * 8);

		if (++coder->pos == 4) {
			if (coder->picky && coder->options.dict_size
					!= UINT32_MAX) {
				// A hack to ditch tons of false positives:
				// We allow only dictionary sizes that are
				// 2^n or 2^n + 2^(n-1). LZMA_Alone created
				// only files with 2^n, but accepts any
				// dictionary size.
				uint32_t d = coder->options.dict_size - 1;
				d |= d >> 2;
				d |= d >> 3;
				d |= d >> 4;
				d |= d >> 8;
				d |= d >> 16;
				++d;

				if (d != coder->options.dict_size)
					return LZMA_FORMAT_ERROR;
			}

			coder->pos = 0;
			coder->sequence = SEQ_UNCOMPRESSED_SIZE;
		}

		++*in_pos;
		break;

	case SEQ_UNCOMPRESSED_SIZE:
		coder->uncompressed_size
				|= (lzma_vli)(in[*in_pos]) << (coder->pos * 8);
		++*in_pos;
		if (++coder->pos < 8)
			break;

		// Another hack to ditch false positives: Assume that
		// if the uncompressed size is known, it must be less
		// than 256 GiB.
		if (coder->picky
				&& coder->uncompressed_size != LZMA_VLI_UNKNOWN
				&& coder->uncompressed_size
					>= (LZMA_VLI_C(1) << 38))
			return LZMA_FORMAT_ERROR;

		// Calculate the memory usage so that it is ready
		// for SEQ_CODER_INIT.
		coder->memusage = lzma_lzma_decoder_memusage(&coder->options)
				+ LZMA_MEMUSAGE_BASE;

		coder->pos = 0;
		coder->sequence = SEQ_CODER_INIT;

	// Fall through

	case SEQ_CODER_INIT: {
		if (coder->memusage > coder->memlimit)
			return LZMA_MEMLIMIT_ERROR;

		lzma_filter_info filters[2] = {
			{
				.init = &lzma_lzma_decoder_init,
				.options = &coder->options,
			}, {
				.init = NULL,
			}
		};

		const lzma_ret ret = lzma_next_filter_init(&coder->next,
				allocator, filters);
		if (ret != LZMA_OK)
			return ret;

		// Use a hack to set the uncompressed size.
		lzma_lz_decoder_uncompressed(coder->next.coder,
				coder->uncompressed_size);

		coder->sequence = SEQ_CODE;
		break;
	}

	case SEQ_CODE: {
		return coder->next.code(coder->next.coder,
				allocator, in, in_pos, in_size,
				out, out_pos, out_size, action);
	}

	default:
		return LZMA_PROG_ERROR;
	}

	return LZMA_OK;
}